

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

void __thiscall
wallet::DescribeWalletAddressVisitor::ProcessSubScript
          (DescribeWalletAddressVisitor *this,CScript *subscript,UniValue *obj)

{
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  bool bVar1;
  byte bVar2;
  TxoutType TVar3;
  size_type sVar4;
  UniValue *in_RDX;
  long in_FS_OFFSET;
  size_t i;
  TxoutType which_type;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solutions_data;
  CPubKey key;
  UniValue pubkeys;
  UniValue wallet_detail;
  UniValue detail;
  UniValue subobj;
  CTxDestination embedded;
  UniValue *in_stack_fffffffffffff658;
  UniValue *in_stack_fffffffffffff660;
  UniValue *in_stack_fffffffffffff668;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff670;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff678;
  UniValue *in_stack_fffffffffffff680;
  UniValue *in_stack_fffffffffffff688;
  ulong uVar5;
  UniValue *in_stack_fffffffffffff690;
  UniValue *pUVar6;
  UniValue *in_stack_fffffffffffff698;
  UniValue *this_00;
  UniValue *in_stack_fffffffffffff6a0;
  UniValue *in_stack_fffffffffffff6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined4 in_stack_fffffffffffff6e0;
  TxoutType in_stack_fffffffffffff6e4;
  undefined7 in_stack_fffffffffffff6e8;
  undefined1 in_stack_fffffffffffff6ef;
  CScript *scriptPubKey;
  ulong local_888;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffff780;
  CScript *in_stack_fffffffffffff788;
  allocator<char> local_849 [20];
  undefined1 local_835 [2];
  allocator<char> local_833;
  allocator<char> local_832;
  allocator<char> local_831 [23];
  allocator<char> local_81a;
  allocator<char> local_819 [23];
  allocator<char> local_802;
  undefined1 local_801 [337];
  UniValue local_6b0 [19];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffff658);
  TVar3 = Solver(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
  scriptPubKey = (CScript *)local_801;
  pUVar6 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6a8,(char *)in_stack_fffffffffffff6a0,
             (allocator<char> *)in_stack_fffffffffffff698);
  GetTxnOutputType_abi_cxx11_(in_stack_fffffffffffff6e4);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffff698,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff690);
  UniValue::pushKV(in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698,
                   in_stack_fffffffffffff690);
  UniValue::~UniValue(in_stack_fffffffffffff658);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658);
  std::allocator<char>::~allocator((allocator<char> *)local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6a8,(char *)in_stack_fffffffffffff6a0,
             (allocator<char> *)in_stack_fffffffffffff698);
  Span<const_unsigned_char>::Span<CScript>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff668,
             (CScript *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  s.m_data._4_4_ = in_stack_fffffffffffff6e4;
  s.m_data._0_4_ = in_stack_fffffffffffff6e0;
  s.m_size._0_7_ = in_stack_fffffffffffff6e8;
  s.m_size._7_1_ = in_stack_fffffffffffff6ef;
  HexStr_abi_cxx11_(s);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffff698,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff690);
  UniValue::pushKV(in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698,
                   in_stack_fffffffffffff690);
  UniValue::~UniValue(in_stack_fffffffffffff658);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff658);
  std::allocator<char>::~allocator(&local_802);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_fffffffffffff658);
  bVar1 = ExtractDestination(scriptPubKey,(CTxDestination *)pUVar6);
  if (bVar1) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff670._M_current);
    UniValue::UniValue((UniValue *)in_stack_fffffffffffff678._M_current,
                       (VType)((ulong)in_stack_fffffffffffff670._M_current >> 0x20),
                       (string *)in_stack_fffffffffffff668);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    DescribeAddress((CTxDestination *)in_stack_fffffffffffff658);
    UniValue::UniValue(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    UniValue::pushKVs(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    UniValue::~UniValue(in_stack_fffffffffffff658);
    std::
    visit<wallet::DescribeWalletAddressVisitor_const&,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>&>
              ((DescribeWalletAddressVisitor *)in_stack_fffffffffffff670._M_current,
               (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff668);
    UniValue::UniValue(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    UniValue::pushKVs(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    UniValue::~UniValue(in_stack_fffffffffffff658);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6a8,(char *)in_stack_fffffffffffff6a0,
               (allocator<char> *)in_stack_fffffffffffff698);
    EncodeDestination_abi_cxx11_((CTxDestination *)in_stack_fffffffffffff668);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_fffffffffffff698,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff690);
    UniValue::pushKV(in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698,
                     in_stack_fffffffffffff690);
    UniValue::~UniValue(in_stack_fffffffffffff658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    std::allocator<char>::~allocator(local_819);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6a8,(char *)in_stack_fffffffffffff6a0,
               (allocator<char> *)in_stack_fffffffffffff698);
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff668,
               (CScript *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
    s_00.m_data._4_4_ = in_stack_fffffffffffff6e4;
    s_00.m_data._0_4_ = in_stack_fffffffffffff6e0;
    s_00.m_size._0_7_ = in_stack_fffffffffffff6e8;
    s_00.m_size._7_1_ = in_stack_fffffffffffff6ef;
    HexStr_abi_cxx11_(s_00);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_fffffffffffff698,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff690);
    UniValue::pushKV(in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698,
                     in_stack_fffffffffffff690);
    UniValue::~UniValue(in_stack_fffffffffffff658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    std::allocator<char>::~allocator(&local_81a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6a8,(char *)in_stack_fffffffffffff6a0,
               (allocator<char> *)in_stack_fffffffffffff698);
    bVar2 = UniValue::exists(in_stack_fffffffffffff660,(string *)in_stack_fffffffffffff658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    std::allocator<char>::~allocator(local_831);
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6a8,(char *)in_stack_fffffffffffff6a0,
                 (allocator<char> *)in_stack_fffffffffffff698);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6a8,(char *)in_stack_fffffffffffff6a0,
                 (allocator<char> *)in_stack_fffffffffffff698);
      UniValue::operator[](in_stack_fffffffffffff668,(string *)in_stack_fffffffffffff660);
      UniValue::UniValue(in_stack_fffffffffffff688,in_stack_fffffffffffff680);
      UniValue::pushKV(in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698,
                       in_stack_fffffffffffff690);
      UniValue::~UniValue(in_stack_fffffffffffff658);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff658);
      std::allocator<char>::~allocator(&local_833);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff658);
      std::allocator<char>::~allocator(&local_832);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6a8,(char *)in_stack_fffffffffffff6a0,
               (allocator<char> *)in_stack_fffffffffffff698);
    UniValue::UniValue(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    UniValue::pushKV(in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698,
                     in_stack_fffffffffffff690);
    UniValue::~UniValue(in_stack_fffffffffffff658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    std::allocator<char>::~allocator((allocator<char> *)(local_835 + 1));
    UniValue::~UniValue(in_stack_fffffffffffff658);
    UniValue::~UniValue(in_stack_fffffffffffff658);
    UniValue::~UniValue(in_stack_fffffffffffff658);
  }
  else if (TVar3 == MULTISIG) {
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_835;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_RDX,(allocator<char> *)in_stack_fffffffffffff698);
    this_00 = (UniValue *)0x0;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffff668,(size_type)in_stack_fffffffffffff660);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff668,
               (size_type)in_stack_fffffffffffff660);
    UniValue::UniValue<unsigned_char_&,_unsigned_char,_true>
              (this_00,(uchar *)in_stack_fffffffffffff690);
    UniValue::pushKV(in_RDX,(string *)this_00,in_stack_fffffffffffff690);
    UniValue::~UniValue(in_stack_fffffffffffff658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    std::allocator<char>::~allocator((allocator<char> *)local_835);
    pUVar6 = local_6b0;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff670._M_current);
    UniValue::UniValue((UniValue *)in_stack_fffffffffffff678._M_current,
                       (VType)((ulong)in_stack_fffffffffffff670._M_current >> 0x20),
                       (string *)in_stack_fffffffffffff668);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    local_888 = 1;
    while (uVar5 = local_888,
          sVar4 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)in_stack_fffffffffffff658), uVar5 < sVar4 - 1) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffff668,(size_type)in_stack_fffffffffffff660);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff660)
      ;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffff668,(size_type)in_stack_fffffffffffff660);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff660)
      ;
      CPubKey::
      CPubKey<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((CPubKey *)in_stack_fffffffffffff658,in_stack_fffffffffffff678,
                 in_stack_fffffffffffff670);
      Span<const_unsigned_char>::Span<CPubKey>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffff668,
                 (CPubKey *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      s_01.m_data._4_4_ = in_stack_fffffffffffff6e4;
      s_01.m_data._0_4_ = in_stack_fffffffffffff6e0;
      s_01.m_size._0_7_ = in_stack_fffffffffffff6e8;
      s_01.m_size._7_1_ = in_stack_fffffffffffff6ef;
      HexStr_abi_cxx11_(s_01);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pUVar6
                );
      UniValue::push_back((UniValue *)in_stack_fffffffffffff670._M_current,in_stack_fffffffffffff668
                         );
      UniValue::~UniValue(in_stack_fffffffffffff658);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff658);
      local_888 = local_888 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_RDX,(allocator<char> *)this_00);
    in_stack_fffffffffffff668 = (UniValue *)(local_801 + 0x19);
    UniValue::UniValue(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    UniValue::pushKV(in_RDX,(string *)this_00,pUVar6);
    UniValue::~UniValue(in_stack_fffffffffffff658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff658);
    std::allocator<char>::~allocator(local_849);
    UniValue::~UniValue(in_stack_fffffffffffff658);
  }
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff658);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffff668);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProcessSubScript(const CScript& subscript, UniValue& obj) const
    {
        // Always present: script type and redeemscript
        std::vector<std::vector<unsigned char>> solutions_data;
        TxoutType which_type = Solver(subscript, solutions_data);
        obj.pushKV("script", GetTxnOutputType(which_type));
        obj.pushKV("hex", HexStr(subscript));

        CTxDestination embedded;
        if (ExtractDestination(subscript, embedded)) {
            // Only when the script corresponds to an address.
            UniValue subobj(UniValue::VOBJ);
            UniValue detail = DescribeAddress(embedded);
            subobj.pushKVs(std::move(detail));
            UniValue wallet_detail = std::visit(*this, embedded);
            subobj.pushKVs(std::move(wallet_detail));
            subobj.pushKV("address", EncodeDestination(embedded));
            subobj.pushKV("scriptPubKey", HexStr(subscript));
            // Always report the pubkey at the top level, so that `getnewaddress()['pubkey']` always works.
            if (subobj.exists("pubkey")) obj.pushKV("pubkey", subobj["pubkey"]);
            obj.pushKV("embedded", std::move(subobj));
        } else if (which_type == TxoutType::MULTISIG) {
            // Also report some information on multisig scripts (which do not have a corresponding address).
            obj.pushKV("sigsrequired", solutions_data[0][0]);
            UniValue pubkeys(UniValue::VARR);
            for (size_t i = 1; i < solutions_data.size() - 1; ++i) {
                CPubKey key(solutions_data[i].begin(), solutions_data[i].end());
                pubkeys.push_back(HexStr(key));
            }
            obj.pushKV("pubkeys", std::move(pubkeys));
        }
    }